

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Maybe<kj::AutoCloseFd> * __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenFileInternal
          (Maybe<kj::AutoCloseFd> *__return_storage_ptr__,DiskHandle *this,PathPtr path,
          WriteMode mode,bool append)

{
  uint __oflag;
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int code;
  Maybe<kj::AutoCloseFd> *extraout_RAX;
  Maybe<kj::AutoCloseFd> *extraout_RAX_00;
  undefined4 extraout_var;
  Maybe<kj::AutoCloseFd> *extraout_RAX_01;
  char *pcVar5;
  PathPtr PVar6;
  char local_6c;
  AutoCloseFd result;
  PathPtr path_local;
  String filename;
  
  path_local.parts.size_ = path.parts.size_;
  path_local.parts.ptr = path.parts.ptr;
  if ((mode & CREATE) == 0) {
    if ((mode & MODIFY) == 0) {
      (__return_storage_ptr__->ptr).isSet = false;
      return __return_storage_ptr__;
    }
    uVar3 = 0x80002;
    local_6c = '\x01';
  }
  else {
    local_6c = (char)((mode & MODIFY) >> 1);
    uVar3 = (uint)((mode & MODIFY) == 0) << 7 | 0x80042;
  }
  __oflag = uVar3 | 0x400;
  if (!append) {
    __oflag = uVar3;
  }
  PathPtr::toString(&filename,&path_local,false);
  do {
    pcVar5 = "";
    if (filename.content.size_ != 0) {
      pcVar5 = filename.content.ptr;
    }
    iVar4 = openat((this->fd).fd,pcVar5,__oflag);
    if (-1 < iVar4) goto LAB_00219d68;
    code = _::Debug::getOsErrorNumber(false);
  } while (code == -1);
  if (code < 0x11) {
    if (code == 0) {
LAB_00219d68:
      result.fd = iVar4;
      UnwindDetector::UnwindDetector(&result.unwindDetector);
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.fd = result.fd;
      UnwindDetector::UnwindDetector(&(__return_storage_ptr__->ptr).field_1.value.unwindDetector);
      result.fd = -1;
      AutoCloseFd::~AutoCloseFd(&result);
      __return_storage_ptr__ = extraout_RAX;
      goto LAB_00219e27;
    }
    if (code != 2) goto LAB_00219da9;
    if ((mode & CREATE) != 0) {
      if (((mode & CREATE_PARENT) != 0) && (path_local.parts.size_ != 0)) {
        PVar6 = PathPtr::parent(&path_local);
        bVar2 = tryMkdir(this,PVar6,CREATE_PARENT|MODIFY|CREATE,true);
        if (bVar2) {
          PVar6.parts.size_ = path_local.parts.size_;
          PVar6.parts.ptr = path_local.parts.ptr;
          __return_storage_ptr__ =
               tryOpenFileInternal(__return_storage_ptr__,this,PVar6,mode & ~CREATE_PARENT,append);
          goto LAB_00219e27;
        }
      }
      if (local_6c == '\0') {
        pcVar5 = filename.content.ptr;
        if (filename.content.size_ == 0) {
          pcVar5 = "";
        }
        iVar4 = faccessat((this->fd).fd,pcVar5,0,0x100);
        if (-1 < iVar4) goto LAB_00219e20;
      }
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::PathPtr&>
                ((Fault *)&result,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x401,FAILED,(char *)0x0,"\"parent is not a directory\", path",
                 (char (*) [26])"parent is not a directory",&path_local);
      (__return_storage_ptr__->ptr).isSet = false;
      _::Debug::Fault::~Fault((Fault *)&result);
      __return_storage_ptr__ = extraout_RAX_01;
      goto LAB_00219e27;
    }
  }
  else if (code == 0x11) {
    if (local_6c != '\0') goto LAB_00219da9;
  }
  else if ((code != 0x14) || ((mode & CREATE) != 0)) {
LAB_00219da9:
    _::Debug::Fault::Fault<int,kj::PathPtr&>
              ((Fault *)&result,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x414,code,"openat(fd, path, O_RDWR | ...)","path",&path_local);
    (__return_storage_ptr__->ptr).isSet = false;
    _::Debug::Fault::~Fault((Fault *)&result);
    __return_storage_ptr__ = extraout_RAX_00;
    goto LAB_00219e27;
  }
LAB_00219e20:
  (__return_storage_ptr__->ptr).isSet = false;
LAB_00219e27:
  sVar1 = filename.content.size_;
  pcVar5 = filename.content.ptr;
  if (filename.content.ptr != (char *)0x0) {
    filename.content.ptr = (char *)0x0;
    filename.content.size_ = 0;
    iVar4 = (**(filename.content.disposer)->_vptr_ArrayDisposer)
                      (filename.content.disposer,pcVar5,1,sVar1,sVar1,0);
    __return_storage_ptr__ = (Maybe<kj::AutoCloseFd> *)CONCAT44(extraout_var,iVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

Maybe<AutoCloseFd> tryOpenFileInternal(PathPtr path, WriteMode mode, bool append) const {
    uint flags = O_RDWR | MAYBE_O_CLOEXEC;
    mode_t acl = 0666;
    if (has(mode, WriteMode::CREATE)) {
      flags |= O_CREAT;
    }
    if (!has(mode, WriteMode::MODIFY)) {
      if (!has(mode, WriteMode::CREATE)) {
        // Neither CREATE nor MODIFY -- impossible to satisfy preconditions.
        return nullptr;
      }
      flags |= O_EXCL;
    }
    if (append) {
      flags |= O_APPEND;
    }
    if (has(mode, WriteMode::EXECUTABLE)) {
      acl = 0777;
    }
    if (has(mode, WriteMode::PRIVATE)) {
      acl &= 0700;
    }

    auto filename = path.toString();

    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(fd, filename.cStr(), flags, acl)) {
      case ENOENT:
        if (has(mode, WriteMode::CREATE)) {
          // Either:
          // - The file is a broken symlink.
          // - A parent directory didn't exist.
          if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
              tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                      WriteMode::CREATE_PARENT, true)) {
            // Retry, but make sure we don't try to create the parent again.
            return tryOpenFileInternal(path, mode - WriteMode::CREATE_PARENT, append);
          }

          // Check for broken link.
          if (!has(mode, WriteMode::MODIFY) &&
              faccessat(fd, filename.cStr(), F_OK, AT_SYMLINK_NOFOLLOW) >= 0) {
            // Yep. We treat this as already-exists, which means in CREATE-only mode this is a
            // simple failure.
            return nullptr;
          }

          KJ_FAIL_REQUIRE("parent is not a directory", path) { return nullptr; }
        } else {
          // MODIFY-only mode. ENOENT = doesn't exist = return null.
          return nullptr;
        }
      case ENOTDIR:
        if (!has(mode, WriteMode::CREATE)) {
          // MODIFY-only mode. ENOTDIR = parent not a directory = doesn't exist = return null.
          return nullptr;
        }
        goto failed;
      case EEXIST:
        if (!has(mode, WriteMode::MODIFY)) {
          // CREATE-only mode. EEXIST = already exists = return null.
          return nullptr;
        }
        goto failed;
      default:
      failed:
        KJ_FAIL_SYSCALL("openat(fd, path, O_RDWR | ...)", error, path) { return nullptr; }
    }

    kj::AutoCloseFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return kj::mv(result);
  }